

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

Point2f __thiscall pbrt::CylindricalMapping2D::cylinder(CylindricalMapping2D *this,Point3f *p)

{
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Point3<float> PVar5;
  Vector3<float> VVar6;
  Vector3f vec;
  Point3<float> *in_stack_00000118;
  Transform *in_stack_00000120;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  Point3<float> *this_00;
  Point3<float> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff94;
  Point3<float> local_64;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  ulong local_28;
  float local_20;
  Tuple2<pbrt::Point2,_float> local_8;
  
  auVar4 = in_ZMM0._8_56_;
  PVar5 = Transform::operator()(in_stack_00000120,in_stack_00000118);
  local_50 = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar4;
  local_58 = vmovlpd_avx(auVar1._0_16_);
  this_00 = &local_64;
  auVar4 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  local_48 = local_58;
  local_40 = local_50;
  Point3<float>::Point3(this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0.0);
  VVar6 = Point3<float>::operator-
                    ((Point3<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  local_30 = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar4;
  local_38 = vmovlpd_avx(auVar2._0_16_);
  VVar6 = Normalize<float>((Vector3<float> *)CONCAT44(in_stack_ffffffffffffff94,local_30));
  local_20 = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  local_28 = vmovlpd_avx(auVar3._0_16_);
  std::atan2((double)(local_28 >> 0x20),(double)(local_28 & 0xffffffff));
  Point2<float>::Point2
            ((Point2<float> *)this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f cylinder(const Point3f &p) const {
        Vector3f vec = Normalize(textureFromRender(p) - Point3f(0, 0, 0));
        return Point2f((Pi + std::atan2(vec.y, vec.x)) * Inv2Pi, vec.z);
    }